

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O0

bool __thiscall
Diligent::PipelineResourceSignatureVkImpl::DvpValidateCommittedResource
          (PipelineResourceSignatureVkImpl *this,DeviceContextVkImpl *pDeviceCtx,
          SPIRVShaderResourceAttribs *SPIRVAttribs,Uint32 ResIndex,
          ShaderResourceCacheVk *ResourceCache,char *ShaderName,char *PSOName)

{
  String *pSVar1;
  ushort uVar2;
  undefined *puVar3;
  bool bVar4;
  DescriptorType DVar5;
  RESOURCE_DIMENSION ExpectedResourceDim;
  int iVar6;
  Uint32 UVar7;
  VALIDATION_FLAGS VVar8;
  Char *pCVar9;
  DescriptorSet *this_00;
  PipelineResourceDesc *ResDesc_00;
  PipelineResourceAttribsType *this_01;
  DescriptorSet *this_02;
  BufferDesc *pBVar10;
  BufferDesc *pBVar11;
  BufferViewVkImpl *this_03;
  IBuffer *Ptr;
  BufferVkImpl *pBuffer;
  BufferViewDesc *Args;
  RenderDeviceVkImpl *pRVar12;
  undefined8 uVar13;
  char (*Args_2) [15];
  undefined8 uVar14;
  TextureViewVkImpl *pViewImpl;
  PipelineResourceDesc *Args_1;
  char (*Args_1_00) [47];
  char *pcVar15;
  char (*Args_1_01) [117];
  Uint64 *in_stack_fffffffffffffbc8;
  String *in_stack_fffffffffffffbd8;
  char (*in_stack_fffffffffffffbe8) [108];
  TextureViewVkImpl *pTexViewVk;
  string msg_7;
  undefined1 local_2d0 [8];
  string _msg_4;
  undefined1 local_290 [8];
  string _msg_3;
  BufferDesc *BuffDesc;
  BufferViewDesc *ViewDesc;
  BufferVkImpl *pBufferVk_1;
  BufferViewVkImpl *pBufferViewVk;
  string msg_6;
  undefined1 local_210 [8];
  string _msg_2;
  BufferVkImpl *pBufferVk;
  string msg_5;
  undefined1 local_1a8 [8];
  string _msg_1;
  Resource *Sam;
  Uint32 SamCacheOffset;
  DescriptorSet *SamDescrSetResources;
  string msg_4;
  string msg_3;
  PipelineResourceAttribsType *SamplerAttribs;
  PipelineResourceDesc *SamplerResDesc;
  undefined1 local_100 [8];
  string _msg;
  Resource *Res;
  Uint32 ArrIndex;
  bool BindingsOK;
  string msg_2;
  Uint32 CacheOffset;
  ResourceCacheContentType CacheType;
  DescriptorSet *DescrSetResources;
  string msg_1;
  PipelineResourceAttribsType *ResAttribs;
  PipelineResourceDesc *ResDesc;
  undefined1 local_60 [8];
  string msg;
  char *ShaderName_local;
  ShaderResourceCacheVk *ResourceCache_local;
  Uint32 ResIndex_local;
  SPIRVShaderResourceAttribs *SPIRVAttribs_local;
  DeviceContextVkImpl *pDeviceCtx_local;
  PipelineResourceSignatureVkImpl *this_local;
  
  msg.field_2._8_8_ = ShaderName;
  if ((this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.NumResources <= ResIndex) {
    FormatString<char[26],char[31]>
              ((string *)local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResIndex < m_Desc.NumResources",(char (*) [31])this);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar9,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
               ,0x329);
    std::__cxx11::string::~string((string *)local_60);
  }
  Args_1 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
           .m_Desc.Resources + ResIndex;
  msg_1.field_2._8_8_ =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_pResourceAttribs
       + ResIndex;
  iVar6 = strcmp(Args_1->Name,SPIRVAttribs->Name);
  if (iVar6 != 0) {
    FormatString<char[28]>
              ((string *)&DescrSetResources,(char (*) [28])"Inconsistent resource names");
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar9,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
               ,0x32c);
    std::__cxx11::string::~string((string *)&DescrSetResources);
  }
  if ((Args_1->ResourceType == SHADER_RESOURCE_TYPE_SAMPLER) &&
     (bVar4 = PipelineResourceAttribsVk::IsImmutableSamplerAssigned
                        ((PipelineResourceAttribsVk *)msg_1.field_2._8_8_), bVar4)) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = ShaderResourceCacheVk::GetDescriptorSet
                        (ResourceCache,(uint)((ulong)*(undefined8 *)msg_1.field_2._8_8_ >> 0x3e) & 1
                        );
    msg_2.field_2._M_local_buf[0xf] = ShaderResourceCacheVk::GetContentType(ResourceCache);
    msg_2.field_2._8_4_ =
         PipelineResourceAttribsVk::CacheOffset
                   ((PipelineResourceAttribsVk *)msg_1.field_2._8_8_,msg_2.field_2._M_local_buf[0xf]
                   );
    Args_1_00 = (char (*) [47])(*(ulong *)msg_1.field_2._8_8_ >> 0x20 & 0x1ffffff);
    if ((uint)Args_1_00 < (uint)SPIRVAttribs->ArraySize) {
      FormatString<char[26],char[47]>
                ((string *)&ArrIndex,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SPIRVAttribs.ArraySize <= ResAttribs.ArraySize",Args_1_00);
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar9,"DvpValidateCommittedResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                 ,0x335);
      std::__cxx11::string::~string((string *)&ArrIndex);
    }
    this_local._7_1_ = true;
    for (Res._0_4_ = 0; pcVar15 = (char *)(ulong)SPIRVAttribs->ArraySize,
        (uint)Res < SPIRVAttribs->ArraySize; Res._0_4_ = (uint)Res + 1) {
      _msg.field_2._8_8_ =
           ShaderResourceCacheVk::DescriptorSet::GetResource
                     (this_00,msg_2.field_2._8_4_ + (uint)Res);
      bVar4 = ShaderResourceCacheVk::Resource::IsNull((Resource *)_msg.field_2._8_8_);
      if (bVar4) {
        GetShaderResourcePrintName<Diligent::SPIRVShaderResourceAttribs>
                  ((String *)&SamplerResDesc,SPIRVAttribs,(uint)Res);
        FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                  ((string *)local_100,(Diligent *)"No resource is bound to variable \'",
                   (char (*) [35])&SamplerResDesc,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\' in shader \'",(char (*) [14])((long)&msg.field_2 + 8),(char **)"\' of PSO \'"
                   ,(char (*) [11])&PSOName,(char **)0xe2ad32,
                   (char (*) [2])in_stack_fffffffffffffbc8);
        std::__cxx11::string::~string((string *)&SamplerResDesc);
        puVar3 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar13 = std::__cxx11::string::c_str();
          (*(code *)puVar3)(2,uVar13,0);
        }
        std::__cxx11::string::~string((string *)local_100);
        this_local._7_1_ = false;
      }
      else {
        bVar4 = PipelineResourceAttribsVk::IsCombinedWithSampler
                          ((PipelineResourceAttribsVk *)msg_1.field_2._8_8_);
        if (bVar4) {
          ResDesc_00 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                                 (&this->
                                   super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                                  ,(uint)((ulong)*(undefined8 *)msg_1.field_2._8_8_ >> 0x10) &
                                   0xffff);
          this_01 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                              (&this->
                                super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                               (uint)((ulong)*(undefined8 *)msg_1.field_2._8_8_ >> 0x10) & 0xffff);
          if (ResDesc_00->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
            FormatString<char[26],char[60]>
                      ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Debug expression failed:\n"
                       ,(char (*) [26])"SamplerResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER"
                       ,(char (*) [60])pcVar15);
            pCVar9 = (Char *)std::__cxx11::string::c_str();
            pcVar15 = (char *)0x347;
            DebugAssertionFailed
                      (pCVar9,"DvpValidateCommittedResource",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                       ,0x347);
            std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
          }
          if ((ResDesc_00->ArraySize != 1) &&
             (pcVar15 = (char *)Args_1, ResDesc_00->ArraySize != Args_1->ArraySize)) {
            FormatString<char[26],char[79]>
                      ((string *)&SamDescrSetResources,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])
                       "SamplerResDesc.ArraySize == 1 || SamplerResDesc.ArraySize == ResDesc.ArraySize"
                       ,(char (*) [79])Args_1);
            pCVar9 = (Char *)std::__cxx11::string::c_str();
            pcVar15 = (char *)0x348;
            DebugAssertionFailed
                      (pCVar9,"DvpValidateCommittedResource",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                       ,0x348);
            std::__cxx11::string::~string((string *)&SamDescrSetResources);
          }
          bVar4 = PipelineResourceAttribsVk::IsImmutableSamplerAssigned(this_01);
          if ((!bVar4) && (pcVar15 = (char *)ResDesc_00, (uint)Res < ResDesc_00->ArraySize)) {
            this_02 = ShaderResourceCacheVk::GetDescriptorSet
                                (ResourceCache,(uint)((ulong)*(undefined8 *)this_01 >> 0x3e) & 1);
            UVar7 = PipelineResourceAttribsVk::CacheOffset(this_01,msg_2.field_2._M_local_buf[0xf]);
            _msg_1.field_2._8_8_ =
                 ShaderResourceCacheVk::DescriptorSet::GetResource(this_02,UVar7 + (uint)Res);
            bVar4 = ShaderResourceCacheVk::Resource::IsNull((Resource *)_msg_1.field_2._8_8_);
            if (bVar4) {
              pSVar1 = (String *)((long)&msg_5.field_2 + 8);
              GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                        (pSVar1,ResDesc_00,(uint)Res);
              in_stack_fffffffffffffbc8 = (Uint64 *)&PSOName;
              pcVar15 = "\' combined with texture \'";
              FormatString<char[42],std::__cxx11::string,char[26],char_const*,char[14],char_const*,char[11],char_const*,char[3]>
                        ((string *)local_1a8,
                         (Diligent *)"No sampler is bound to sampler variable \'",
                         (char (*) [42])pSVar1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "\' combined with texture \'",(char (*) [26])SPIRVAttribs,
                         (char **)"\' in shader \'",(char (*) [14])((long)&msg.field_2 + 8),
                         (char **)"\' of PSO \'",(char (*) [11])in_stack_fffffffffffffbc8,
                         (char **)"\'.",(char (*) [3])in_stack_fffffffffffffbd8);
              std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
              puVar3 = DebugMessageCallback;
              if (DebugMessageCallback != (undefined *)0x0) {
                uVar13 = std::__cxx11::string::c_str();
                pcVar15 = (char *)0x0;
                (*(code *)puVar3)(2,uVar13,0);
              }
              std::__cxx11::string::~string((string *)local_1a8);
              this_local._7_1_ = false;
            }
          }
        }
        DVar5 = PipelineResourceAttribsVk::GetDescriptorType
                          ((PipelineResourceAttribsVk *)msg_1.field_2._8_8_);
        Args_1_01 = (char (*) [117])CONCAT71((int7)((ulong)pcVar15 >> 8),DVar5);
        if ((byte)(DVar5 - CombinedImageSampler) < 3) {
          if ((Args_1->ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV) &&
             (Args_1->ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_UAV)) {
            FormatString<char[26],char[117]>
                      ((string *)&pTexViewVk,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])
                       "ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV"
                       ,Args_1_01);
            pCVar9 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar9,"DvpValidateCommittedResource",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                       ,0x39e);
            std::__cxx11::string::~string((string *)&pTexViewVk);
          }
          pViewImpl = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::TextureViewVkImpl>
                                ((RefCntAutoPtr<Diligent::IDeviceObject> *)(_msg.field_2._8_8_ + 8))
          ;
          if (pViewImpl != (TextureViewVkImpl *)0x0) {
            pcVar15 = SPIRVAttribs->Name;
            uVar2 = SPIRVAttribs->ArraySize;
            ExpectedResourceDim = SPIRVShaderResourceAttribs::GetResourceDimension(SPIRVAttribs);
            bVar4 = SPIRVShaderResourceAttribs::IsMultisample(SPIRVAttribs);
            bVar4 = ValidateResourceViewDimension<Diligent::TextureViewVkImpl>
                              (pcVar15,(uint)uVar2,(uint)Res,pViewImpl,ExpectedResourceDim,bVar4);
            if (!bVar4) {
              this_local._7_1_ = false;
            }
          }
        }
        else if ((byte)(DVar5 - UniformBuffer) < 2) {
          if (Args_1->ResourceType != SHADER_RESOURCE_TYPE_CONSTANT_BUFFER) {
            FormatString<char[26],char[61]>
                      ((string *)&pBufferVk,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"ResDesc.ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER"
                       ,(char (*) [61])Args_1_01);
            pCVar9 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar9,"DvpValidateCommittedResource",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                       ,0x35e);
            std::__cxx11::string::~string((string *)&pBufferVk);
          }
          _msg_2.field_2._8_8_ =
               RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::BufferVkImpl>
                         ((RefCntAutoPtr<Diligent::IDeviceObject> *)(_msg.field_2._8_8_ + 8));
          if ((BufferVkImpl *)_msg_2.field_2._8_8_ != (BufferVkImpl *)0x0) {
            DeviceContextVkImpl::DvpVerifyDynamicAllocation
                      (pDeviceCtx,(BufferVkImpl *)_msg_2.field_2._8_8_);
            pBVar10 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                      ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                 *)_msg_2.field_2._8_8_);
            if (pBVar10->Size < (ulong)SPIRVAttribs->BufferStaticSize) {
              pRVar12 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                        ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                     *)this);
              VVar8 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetValidationFlags
                                ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar12);
              VVar8 = Diligent::operator&(VVar8,VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE);
              if (VVar8 != VALIDATION_FLAG_NONE) {
                pBVar10 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                     *)_msg_2.field_2._8_8_);
                GetShaderResourcePrintName<Diligent::SPIRVShaderResourceAttribs>
                          ((String *)((long)&msg_6.field_2 + 8),SPIRVAttribs,(uint)Res);
                pBVar11 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                     *)_msg_2.field_2._8_8_);
                in_stack_fffffffffffffbc8 = (Uint64 *)&SPIRVAttribs->BufferStaticSize;
                FormatString<char[29],char_const*,char[29],std::__cxx11::string,char[6],unsigned_long,char[41],unsigned_int,char[8]>
                          ((string *)local_210,(Diligent *)"The size of uniform buffer \'",
                           (char (*) [29])pBVar10,(char **)"\' bound to shader variable \'",
                           (char (*) [29])((long)&msg_6.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "\' is ",(char (*) [6])&pBVar11->Size,
                           (unsigned_long *)" bytes, but the shader expects at least ",
                           (char (*) [41])in_stack_fffffffffffffbc8,(uint *)0xf4d634,
                           (char (*) [8])in_stack_fffffffffffffbd8);
                std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
                puVar3 = DebugMessageCallback;
                if (DebugMessageCallback != (undefined *)0x0) {
                  uVar13 = std::__cxx11::string::c_str();
                  (*(code *)puVar3)(1,uVar13,0);
                }
                std::__cxx11::string::~string((string *)local_210);
              }
            }
          }
        }
        else if ((byte)(DVar5 - StorageBuffer) < 4) {
          if ((Args_1->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_UAV) &&
             (Args_1->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_SRV)) {
            FormatString<char[26],char[115]>
                      ((string *)&pBufferViewVk,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])
                       "ResDesc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV"
                       ,(char (*) [115])Args_1_01);
            pCVar9 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar9,"DvpValidateCommittedResource",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                       ,0x376);
            std::__cxx11::string::~string((string *)&pBufferViewVk);
          }
          this_03 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::BufferViewVkImpl>
                              ((RefCntAutoPtr<Diligent::IDeviceObject> *)(_msg.field_2._8_8_ + 8));
          if (this_03 != (BufferViewVkImpl *)0x0) {
            Ptr = BufferViewBase<Diligent::EngineVkImplTraits>::GetBuffer
                            (&this_03->super_BufferViewBase<Diligent::EngineVkImplTraits>);
            pBuffer = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(Ptr);
            Args = DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                   ::GetDesc((DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                              *)this_03);
            _msg_3.field_2._8_8_ =
                 DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                 ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                            *)pBuffer);
            DeviceContextVkImpl::DvpVerifyDynamicAllocation(pDeviceCtx,pBuffer);
            if (*(int *)(_msg_3.field_2._8_8_ + 0x18) == 0) {
              if (Args->ByteWidth < (ulong)SPIRVAttribs->BufferStaticSize) {
                pRVar12 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                       *)this);
                VVar8 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetValidationFlags
                                  ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar12);
                VVar8 = Diligent::operator&(VVar8,VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE);
                uVar13 = _msg_3.field_2._8_8_;
                if (VVar8 != VALIDATION_FLAG_NONE) {
                  pSVar1 = (String *)((long)&_msg_4.field_2 + 8);
                  GetShaderResourcePrintName<Diligent::SPIRVShaderResourceAttribs>
                            (pSVar1,SPIRVAttribs,(uint)Res);
                  in_stack_fffffffffffffbc8 = &Args->ByteWidth;
                  in_stack_fffffffffffffbd8 = (String *)&SPIRVAttribs->BufferStaticSize;
                  FormatString<char[26],char_const*,char[14],char_const*,char[29],std::__cxx11::string,char[6],unsigned_long,char[41],unsigned_int,char[8]>
                            ((string *)local_290,(Diligent *)"The size of buffer view \'",
                             (char (*) [26])Args,(char **)"\' of buffer \'",(char (*) [14])uVar13,
                             (char **)"\' bound to shader variable \'",(char (*) [29])pSVar1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "\' is ",(char (*) [6])in_stack_fffffffffffffbc8,
                             (unsigned_long *)" bytes, but the shader expects at least ",
                             (char (*) [41])in_stack_fffffffffffffbd8,(uint *)0xf4d634,
                             (char (*) [8])in_stack_fffffffffffffbe8);
                  std::__cxx11::string::~string((string *)(_msg_4.field_2._M_local_buf + 8));
                  puVar3 = DebugMessageCallback;
                  if (DebugMessageCallback != (undefined *)0x0) {
                    uVar13 = std::__cxx11::string::c_str();
                    (*(code *)puVar3)(1,uVar13,0);
                  }
                  std::__cxx11::string::~string((string *)local_290);
                }
              }
            }
            else if ((Args->ByteWidth < (ulong)SPIRVAttribs->BufferStaticSize) ||
                    ((Args->ByteWidth - (ulong)SPIRVAttribs->BufferStaticSize) %
                     (ulong)*(uint *)(_msg_3.field_2._8_8_ + 0x18) != 0)) {
              pRVar12 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                        ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                     *)this);
              VVar8 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetValidationFlags
                                ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar12);
              VVar8 = Diligent::operator&(VVar8,VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE);
              uVar13 = _msg_3.field_2._8_8_;
              if (VVar8 != VALIDATION_FLAG_NONE) {
                Args_2 = (char (*) [15])(_msg_3.field_2._8_8_ + 0x18);
                in_stack_fffffffffffffbd8 = (String *)((long)&msg_7.field_2 + 8);
                GetShaderResourcePrintName<Diligent::SPIRVShaderResourceAttribs>
                          (in_stack_fffffffffffffbd8,SPIRVAttribs,(uint)Res);
                FormatString<char[11],unsigned_long,char[15],unsigned_int,char[19],char_const*,char[14],char_const*,char[29],std::__cxx11::string,char[108]>
                          ((string *)local_2d0,(Diligent *)"The size (",
                           (char (*) [11])&Args->ByteWidth,(unsigned_long *)") and stride (",Args_2,
                           (uint *)") of buffer view \'",(char (*) [19])Args,
                           (char **)"\' of buffer \'",(char (*) [14])uVar13,
                           (char **)"\' bound to shader variable \'",
                           (char (*) [29])in_stack_fffffffffffffbd8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "\' are incompatible with what the shader expects. This may be the result of the array element size mismatch."
                           ,in_stack_fffffffffffffbe8);
                std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
                puVar3 = DebugMessageCallback;
                if (DebugMessageCallback != (undefined *)0x0) {
                  uVar14 = std::__cxx11::string::c_str();
                  (*(code *)puVar3)(1,uVar14,0);
                }
                std::__cxx11::string::~string((string *)local_2d0);
                in_stack_fffffffffffffbc8 = (Uint64 *)uVar13;
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool PipelineResourceSignatureVkImpl::DvpValidateCommittedResource(const DeviceContextVkImpl*        pDeviceCtx,
                                                                   const SPIRVShaderResourceAttribs& SPIRVAttribs,
                                                                   Uint32                            ResIndex,
                                                                   const ShaderResourceCacheVk&      ResourceCache,
                                                                   const char*                       ShaderName,
                                                                   const char*                       PSOName) const
{
    VERIFY_EXPR(ResIndex < m_Desc.NumResources);
    const auto& ResDesc    = m_Desc.Resources[ResIndex];
    const auto& ResAttribs = m_pResourceAttribs[ResIndex];
    VERIFY(strcmp(ResDesc.Name, SPIRVAttribs.Name) == 0, "Inconsistent resource names");

    if (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER && ResAttribs.IsImmutableSamplerAssigned())
        return true; // Skip immutable separate samplers

    const auto& DescrSetResources = ResourceCache.GetDescriptorSet(ResAttribs.DescrSet);
    const auto  CacheType         = ResourceCache.GetContentType();
    const auto  CacheOffset       = ResAttribs.CacheOffset(CacheType);

    VERIFY_EXPR(SPIRVAttribs.ArraySize <= ResAttribs.ArraySize);

    bool BindingsOK = true;
    for (Uint32 ArrIndex = 0; ArrIndex < SPIRVAttribs.ArraySize; ++ArrIndex)
    {
        const auto& Res = DescrSetResources.GetResource(CacheOffset + ArrIndex);
        if (Res.IsNull())
        {
            LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(SPIRVAttribs, ArrIndex),
                              "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
            BindingsOK = false;
            continue;
        }

        if (ResAttribs.IsCombinedWithSampler())
        {
            const auto& SamplerResDesc = GetResourceDesc(ResAttribs.SamplerInd);
            const auto& SamplerAttribs = GetResourceAttribs(ResAttribs.SamplerInd);
            VERIFY_EXPR(SamplerResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER);
            VERIFY_EXPR(SamplerResDesc.ArraySize == 1 || SamplerResDesc.ArraySize == ResDesc.ArraySize);
            if (!SamplerAttribs.IsImmutableSamplerAssigned())
            {
                if (ArrIndex < SamplerResDesc.ArraySize)
                {
                    const auto& SamDescrSetResources = ResourceCache.GetDescriptorSet(SamplerAttribs.DescrSet);
                    const auto  SamCacheOffset       = SamplerAttribs.CacheOffset(CacheType);
                    const auto& Sam                  = SamDescrSetResources.GetResource(SamCacheOffset + ArrIndex);
                    if (Sam.IsNull())
                    {
                        LOG_ERROR_MESSAGE("No sampler is bound to sampler variable '", GetShaderResourcePrintName(SamplerResDesc, ArrIndex),
                                          "' combined with texture '", SPIRVAttribs.Name, "' in shader '", ShaderName, "' of PSO '", PSOName, "'.");
                        BindingsOK = false;
                    }
                }
            }
        }

        switch (ResAttribs.GetDescriptorType())
        {
            case DescriptorType::UniformBuffer:
            case DescriptorType::UniformBufferDynamic:
                VERIFY_EXPR(ResDesc.ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER);
                // When can use raw cast here because the dynamic type is verified when the resource
                // is bound. It will be null if the type is incorrect.
                if (const auto* pBufferVk = Res.pObject.RawPtr<BufferVkImpl>())
                {
                    pDeviceCtx->DvpVerifyDynamicAllocation(pBufferVk);

                    if ((pBufferVk->GetDesc().Size < SPIRVAttribs.BufferStaticSize) &&
                        (GetDevice()->GetValidationFlags() & VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != 0)
                    {
                        // It is OK if robustBufferAccess feature is enabled, otherwise access outside of buffer range may lead to crash or undefined behavior.
                        LOG_WARNING_MESSAGE("The size of uniform buffer '",
                                            pBufferVk->GetDesc().Name, "' bound to shader variable '",
                                            GetShaderResourcePrintName(SPIRVAttribs, ArrIndex), "' is ", pBufferVk->GetDesc().Size,
                                            " bytes, but the shader expects at least ", SPIRVAttribs.BufferStaticSize,
                                            " bytes.");
                    }
                }
                break;

            case DescriptorType::StorageBuffer:
            case DescriptorType::StorageBuffer_ReadOnly:
            case DescriptorType::StorageBufferDynamic:
            case DescriptorType::StorageBufferDynamic_ReadOnly:
                VERIFY_EXPR(ResDesc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV);
                // When can use raw cast here because the dynamic type is verified when the resource
                // is bound. It will be null if the type is incorrect.
                if (auto* pBufferViewVk = Res.pObject.RawPtr<BufferViewVkImpl>())
                {
                    const auto* pBufferVk = ClassPtrCast<BufferVkImpl>(pBufferViewVk->GetBuffer());
                    const auto& ViewDesc  = pBufferViewVk->GetDesc();
                    const auto& BuffDesc  = pBufferVk->GetDesc();

                    pDeviceCtx->DvpVerifyDynamicAllocation(pBufferVk);

                    if (BuffDesc.ElementByteStride == 0)
                    {
                        if ((ViewDesc.ByteWidth < SPIRVAttribs.BufferStaticSize) &&
                            (GetDevice()->GetValidationFlags() & VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != 0)
                        {
                            // It is OK if robustBufferAccess feature is enabled, otherwise access outside of buffer range may lead to crash or undefined behavior.
                            LOG_WARNING_MESSAGE("The size of buffer view '", ViewDesc.Name, "' of buffer '", BuffDesc.Name, "' bound to shader variable '",
                                                GetShaderResourcePrintName(SPIRVAttribs, ArrIndex), "' is ", ViewDesc.ByteWidth, " bytes, but the shader expects at least ",
                                                SPIRVAttribs.BufferStaticSize, " bytes.");
                        }
                    }
                    else
                    {
                        if ((ViewDesc.ByteWidth < SPIRVAttribs.BufferStaticSize || (ViewDesc.ByteWidth - SPIRVAttribs.BufferStaticSize) % BuffDesc.ElementByteStride != 0) &&
                            (GetDevice()->GetValidationFlags() & VALIDATION_FLAG_CHECK_SHADER_BUFFER_SIZE) != 0)
                        {
                            // For buffers with dynamic arrays we know only static part size and array element stride.
                            // Element stride in the shader may be differ than in the code. Here we check that the buffer size is exactly the same as the array with N elements.
                            LOG_WARNING_MESSAGE("The size (", ViewDesc.ByteWidth, ") and stride (", BuffDesc.ElementByteStride, ") of buffer view '",
                                                ViewDesc.Name, "' of buffer '", BuffDesc.Name, "' bound to shader variable '",
                                                GetShaderResourcePrintName(SPIRVAttribs, ArrIndex), "' are incompatible with what the shader expects. This may be the result of the array element size mismatch.");
                        }
                    }
                }
                break;

            case DescriptorType::StorageImage:
            case DescriptorType::SeparateImage:
            case DescriptorType::CombinedImageSampler:
                VERIFY_EXPR(ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV);
                // When can use raw cast here because the dynamic type is verified when the resource
                // is bound. It will be null if the type is incorrect.
                if (const auto* pTexViewVk = Res.pObject.RawPtr<TextureViewVkImpl>())
                {
                    if (!ValidateResourceViewDimension(SPIRVAttribs.Name, SPIRVAttribs.ArraySize, ArrIndex, pTexViewVk, SPIRVAttribs.GetResourceDimension(), SPIRVAttribs.IsMultisample()))
                        BindingsOK = false;
                }
                break;

            default:
                break;
                // Nothing to do
        }
    }

    return BindingsOK;
}